

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<2UL>::SimpleTypeHandler
          (SimpleTypeHandler<2UL> *this,SimpleTypeHandler<2UL> *typeHandler,bool unused)

{
  code *pcVar1;
  bool bVar2;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  undefined4 *puVar3;
  SimplePropertyDescriptor *local_28;
  int local_20;
  int i;
  bool unused_local;
  SimpleTypeHandler<2UL> *typeHandler_local;
  SimpleTypeHandler<2UL> *this_local;
  
  inlineSlotCapacity =
       DynamicTypeHandler::GetInlineSlotCapacity(&typeHandler->super_DynamicTypeHandler);
  offsetOfInlineSlots =
       DynamicTypeHandler::GetOffsetOfInlineSlots(&typeHandler->super_DynamicTypeHandler);
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,2,inlineSlotCapacity,offsetOfInlineSlots,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e4d888
  ;
  this->propertyCount = typeHandler->propertyCount;
  local_28 = this->descriptors;
  do {
    SimplePropertyDescriptor::SimplePropertyDescriptor(local_28);
    local_28 = local_28 + 1;
  } while ((SimpleTypeHandler<2UL> *)local_28 != this + 1);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&typeHandler->super_DynamicTypeHandler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x11,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  for (local_20 = 0; local_20 < this->propertyCount; local_20 = local_20 + 1) {
    SimplePropertyDescriptor::operator=
              (this->descriptors + local_20,typeHandler->descriptors + local_20);
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler, bool unused)
        : DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
            typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()), propertyCount(typeHandler->propertyCount)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }